

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

void divsufsortxx::substring::
     mintrosort<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>>,char*,bitmap::BitmapArray<long>::iterator>
               (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                *stack,char *T,iterator PA,iterator first,iterator last,value_type depth)

{
  char cVar1;
  iterator *piVar2;
  undefined8 *puVar3;
  pos_type *ppVar4;
  iterator last_00;
  iterator last_01;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_00;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_01;
  iterator last_02;
  char cVar5;
  bool bVar6;
  int iVar7;
  _Elt_pointer psVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  ulong uVar9;
  BitmapArray<long> *pBVar10;
  ulong uVar11;
  BitmapArray<long> *pBVar12;
  long lVar13;
  pos_type pVar14;
  char cVar15;
  pos_type pVar16;
  long lVar17;
  BitmapArray<long> *pBVar18;
  int iVar19;
  iterator first2;
  iterator last_03;
  iterator PA_00;
  iterator PA_01;
  iterator PA_02;
  iterator PA_03;
  iterator iVar20;
  iterator a;
  iterator c;
  BitmapArray<long> *local_128;
  BitmapArray<long> *local_120;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
  local_118;
  iterator local_e8;
  pos_type local_d0;
  iterator local_c8;
  BitmapArray<long> *local_b0;
  int local_a4;
  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
  *local_a0;
  pos_type local_98;
  char *local_90;
  pos_type local_88;
  BitmapArray<long> *local_80;
  BitmapArray<long> *local_78;
  BitmapArray<long> *pBStack_70;
  pos_type local_68;
  BitmapArray<long> *local_60;
  BitmapArray<long> *pBStack_58;
  pos_type local_50;
  BitmapArray<long> *local_48;
  BitmapArray<long> *pBStack_40;
  pos_type local_38;
  
  local_d0 = PA.pos_;
  pBVar12 = PA.array_;
  local_e8 = (iterator)ZEXT816(0);
  local_c8.array_ = (BitmapArray<long> *)0x0;
  local_c8.pos_ = 0;
  uVar9 = last.pos_ - first.pos_;
  iVar19 = 0;
  if (0xff < (long)uVar9) {
    iVar19 = 0;
    uVar11 = uVar9;
    do {
      iVar19 = iVar19 + 8;
      uVar9 = uVar11 >> 8;
      bVar6 = 0xffff < uVar11;
      uVar11 = uVar9;
    } while (bVar6);
  }
  local_128 = (BitmapArray<long> *)depth;
  iVar19 = iVar19 + (&helper::log2table)[uVar9];
  local_a0 = (deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
              *)stack;
  local_90 = T;
LAB_001066ce:
  do {
    while( true ) {
      while( true ) {
        pVar16 = first.pos_;
        local_120 = first.array_;
        lVar13 = last.pos_ - pVar16;
        if (8 < lVar13) break;
        if (1 < lVar13) {
          last_01.pos_ = last.pos_;
          last_01.array_ = last.array_;
          PA_00.pos_ = local_d0;
          PA_00.array_ = pBVar12;
          insertionsort<char*,bitmap::BitmapArray<long>::iterator>
                    (local_90,PA_00,first,last_01,(value_type)local_128);
        }
        psVar8 = *(_Elt_pointer *)((long)stack + 0x30);
        if (psVar8 == *(_Elt_pointer *)((long)stack + 0x10)) {
          return;
        }
        if (psVar8 == *(_Elt_pointer *)((long)stack + 0x38)) {
          psVar8 = (*(_Map_pointer *)((long)stack + 0x48))[-1] + 10;
        }
        first = psVar8[-1].m_a;
        last.array_ = psVar8[-1].m_b.array_;
        last.pos_ = psVar8[-1].m_b.pos_;
        local_128 = (BitmapArray<long> *)psVar8[-1].m_c;
        iVar19 = psVar8[-1].m_d;
        std::
        deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>
        ::pop_back(&stack->c);
      }
      pBVar10 = (BitmapArray<long> *)(local_90 + (long)local_128);
      local_a4 = iVar19 + -1;
      if (iVar19 == 0) {
        local_38 = local_d0;
        Td.m_PA.array_ = pBVar12;
        Td.m_Td = (char *)pBVar10;
        Td.m_PA.pos_ = local_d0;
        local_48 = pBVar10;
        pBStack_40 = pBVar12;
        helper::
        heapsort<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                  (Td,first,lVar13);
      }
      if (0 < iVar19) break;
      local_e8.pos_ = pVar16 + 1;
      local_e8.array_ = local_120;
      iVar19 = (*(local_120->super_Bitmap)._vptr_Bitmap[5])(local_120);
      iVar19 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])
                         (pBVar12,CONCAT44(extraout_var_07,iVar19) + local_d0);
      cVar15 = *(char *)((long)&(pBVar10->super_Bitmap)._vptr_Bitmap +
                        CONCAT44(extraout_var_08,iVar19));
      pVar16 = local_e8.pos_;
      while( true ) {
        if (last.pos_ <= pVar16) break;
        iVar19 = (*((local_e8.array_)->super_Bitmap)._vptr_Bitmap[5])();
        iVar19 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])
                           (pBVar12,CONCAT44(extraout_var_09,iVar19) + local_d0);
        cVar1 = *(char *)((long)&(pBVar10->super_Bitmap)._vptr_Bitmap +
                         CONCAT44(extraout_var_10,iVar19));
        cVar5 = cVar15;
        iVar20 = first;
        if ((cVar1 != cVar15) &&
           (cVar5 = cVar1, iVar20 = local_e8, 1 < (long)(local_e8.pos_ - first.pos_))) break;
        first = iVar20;
        cVar15 = cVar5;
        pVar16 = local_e8.pos_ + 1;
        local_e8.pos_ = pVar16;
      }
      iVar19 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
      iVar19 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])
                         (pBVar12,CONCAT44(extraout_var_11,iVar19) + local_d0);
      if (*(char *)((long)pBVar10 + CONCAT44(extraout_var_12,iVar19) + -1) < cVar15) {
        PA_02.pos_ = local_d0;
        PA_02.array_ = pBVar12;
        first = partition<bitmap::BitmapArray<long>::iterator>
                          (PA_02,first,local_e8,(value_type)local_128);
      }
      stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
               *)local_a0;
      uVar9 = local_e8.pos_ - first.pos_;
      if ((long)(last.pos_ - local_e8.pos_) < (long)uVar9) {
        if ((long)(last.pos_ - local_e8.pos_) < 2) {
          last.array_ = local_e8.array_;
          last.pos_ = local_e8.pos_;
          iVar19 = 0;
          if (0xff < (long)uVar9) {
            iVar19 = 0;
            uVar11 = uVar9;
            do {
              iVar19 = iVar19 + 8;
              uVar9 = uVar11 >> 8;
              bVar6 = 0xffff < uVar11;
              uVar11 = uVar9;
            } while (bVar6);
          }
          local_128 = (BitmapArray<long> *)((long)&(local_128->super_Bitmap)._vptr_Bitmap + 1);
          iVar19 = iVar19 + (&helper::log2table)[uVar9];
        }
        else {
          local_118.m_d = 0;
          if (0xff < (long)uVar9) {
            local_118.m_d = 0;
            uVar11 = uVar9;
            do {
              local_118.m_d = local_118.m_d + 8;
              uVar9 = uVar11 >> 8;
              bVar6 = 0xffff < uVar11;
              uVar11 = uVar9;
            } while (bVar6);
          }
          local_118.m_c = (long)&(local_128->super_Bitmap)._vptr_Bitmap + 1;
          local_118.m_d = local_118.m_d + (&helper::log2table)[uVar9];
          local_118.m_b.array_ = local_e8.array_;
          local_118.m_b.pos_ = local_e8.pos_;
          piVar2 = *(iterator **)(local_a0 + 0x30);
          local_118.m_a = first;
          if (piVar2 == (iterator *)(*(long *)(local_a0 + 0x40) + -0x30)) {
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      (local_a0,&local_118);
          }
          else {
            piVar2[2].array_ = (BitmapArray<long> *)local_118.m_c;
            piVar2[2].pos_ = CONCAT44(local_118._44_4_,local_118.m_d);
            piVar2[1].array_ = local_e8.array_;
            piVar2[1].pos_ = local_e8.pos_;
            *piVar2 = first;
            *(long *)(local_a0 + 0x30) = *(long *)(local_a0 + 0x30) + 0x30;
          }
          iVar19 = -1;
          first = local_e8;
        }
      }
      else if ((long)uVar9 < 2) {
        iVar19 = -1;
        first = local_e8;
      }
      else {
        local_118.m_a = local_e8;
        local_118.m_b.array_ = last.array_;
        local_118.m_b.pos_ = last.pos_;
        local_118.m_c = (long)local_128;
        local_118.m_d = -1;
        puVar3 = *(undefined8 **)(local_a0 + 0x30);
        if (puVar3 == (undefined8 *)(*(long *)(local_a0 + 0x40) + -0x30)) {
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    (local_a0,&local_118);
        }
        else {
          puVar3[4] = local_128;
          puVar3[5] = CONCAT44(local_118._44_4_,0xffffffff);
          puVar3[2] = last.array_;
          puVar3[3] = last.pos_;
          *puVar3 = local_e8.array_;
          puVar3[1] = local_e8.pos_;
          *(long *)(local_a0 + 0x30) = *(long *)(local_a0 + 0x30) + 0x30;
        }
        last.array_ = local_e8.array_;
        last.pos_ = local_e8.pos_;
        uVar9 = local_e8.pos_ - first.pos_;
        iVar19 = 0;
        if (0xff < (long)uVar9) {
          iVar19 = 0;
          uVar11 = uVar9;
          do {
            iVar19 = iVar19 + 8;
            uVar9 = uVar11 >> 8;
            bVar6 = 0xffff < uVar11;
            uVar11 = uVar9;
          } while (bVar6);
        }
        local_128 = (BitmapArray<long> *)((long)&(local_128->super_Bitmap)._vptr_Bitmap + 1);
        iVar19 = iVar19 + (&helper::log2table)[uVar9];
      }
    }
    local_50 = local_d0;
    Td_00.m_PA.array_ = pBVar12;
    Td_00.m_Td = (char *)pBVar10;
    Td_00.m_PA.pos_ = local_d0;
    iVar20.pos_ = last.pos_;
    iVar20.array_ = last.array_;
    local_b0 = pBVar10;
    local_60 = pBVar10;
    pBStack_58 = pBVar12;
    local_e8 = helper::
               pivot<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                         (Td_00,first,iVar20);
    pVar14 = local_e8.pos_;
    pBVar10 = local_e8.array_;
    iVar7 = (*(local_120->super_Bitmap)._vptr_Bitmap[5])(local_120,pVar16);
    local_98 = CONCAT44(extraout_var,iVar7);
    iVar7 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,pVar14);
    (*(local_120->super_Bitmap)._vptr_Bitmap[4])(local_120,pVar16,CONCAT44(extraout_var_00,iVar7));
    (*(pBVar10->super_Bitmap)._vptr_Bitmap[4])(pBVar10,pVar14,local_98);
    pBVar10 = local_b0;
    pVar14 = local_d0;
    local_78 = local_b0;
    local_68 = local_d0;
    local_98 = pVar16 + 1;
    local_80 = last.array_;
    local_88 = last.pos_;
    pBStack_70 = pBVar12;
    iVar7 = (*(local_120->super_Bitmap)._vptr_Bitmap[5])(local_120,pVar16);
    iVar7 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])
                      (pBVar12,CONCAT44(extraout_var_01,iVar7) + pVar14);
    Td_01.m_PA.array_ = pBStack_70;
    Td_01.m_Td = (char *)local_78;
    Td_01.m_PA.pos_ = local_68;
    first2.pos_ = local_98;
    first2.array_ = local_120;
    last_03.pos_ = local_88;
    last_03.array_ = local_80;
    bVar6 = helper::
            partition<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                      (Td_01,first,first2,last_03,&local_e8,&local_c8,
                       (value_type *)
                       ((long)&(pBVar10->super_Bitmap)._vptr_Bitmap +
                       CONCAT44(extraout_var_02,iVar7)));
    if (!bVar6) {
      iVar7 = (*(local_120->super_Bitmap)._vptr_Bitmap[5])(local_120,pVar16);
      pVar14 = local_d0;
      iVar7 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar12,CONCAT44(extraout_var_13,iVar7) + local_d0);
      pBVar10 = local_b0;
      local_a4 = CONCAT31(local_a4._1_3_,
                          *(undefined1 *)((long)local_b0 + CONCAT44(extraout_var_14,iVar7) + -1));
      iVar7 = (*(local_120->super_Bitmap)._vptr_Bitmap[5])(local_120,pVar16);
      iVar7 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar12,CONCAT44(extraout_var_15,iVar7) + pVar14);
      if ((char)local_a4 <
          *(char *)((long)&(pBVar10->super_Bitmap)._vptr_Bitmap + CONCAT44(extraout_var_16,iVar7)))
      {
        last_00.pos_ = last.pos_;
        last_00.array_ = last.array_;
        PA_03.pos_ = local_d0;
        PA_03.array_ = pBVar12;
        first = partition<bitmap::BitmapArray<long>::iterator>
                          (PA_03,first,last_00,(value_type)local_128);
        uVar9 = last.pos_ - first.pos_;
        iVar19 = 0;
        if (0xff < (long)uVar9) {
          iVar19 = 0;
          uVar11 = uVar9;
          do {
            iVar19 = iVar19 + 8;
            uVar9 = uVar11 >> 8;
            bVar6 = 0xffff < uVar11;
            uVar11 = uVar9;
          } while (bVar6);
        }
        iVar19 = iVar19 + (&helper::log2table)[uVar9];
      }
      local_128 = (BitmapArray<long> *)((long)&(local_128->super_Bitmap)._vptr_Bitmap + 1);
      stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
               *)local_a0;
      goto LAB_001066ce;
    }
    iVar19 = (*((local_e8.array_)->super_Bitmap)._vptr_Bitmap[5])(local_e8.array_,local_e8.pos_);
    pVar14 = local_d0;
    iVar19 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])
                       (pBVar12,CONCAT44(extraout_var_03,iVar19) + local_d0);
    pBVar10 = local_b0;
    cVar15 = *(char *)((long)&(local_b0->super_Bitmap)._vptr_Bitmap +
                      CONCAT44(extraout_var_04,iVar19));
    iVar19 = (*((local_e8.array_)->super_Bitmap)._vptr_Bitmap[5])(local_e8.array_,local_e8.pos_);
    iVar19 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])
                       (pBVar12,CONCAT44(extraout_var_05,iVar19) + pVar14);
    iVar20 = local_e8;
    if (*(char *)((long)pBVar10 + CONCAT44(extraout_var_06,iVar19) + -1) < cVar15) {
      last_02.pos_ = local_c8.pos_;
      last_02.array_ = local_c8.array_;
      PA_01.pos_ = local_d0;
      PA_01.array_ = pBVar12;
      iVar20 = partition<bitmap::BitmapArray<long>::iterator>
                         (PA_01,local_e8,last_02,(value_type)local_128);
    }
    stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
             *)local_a0;
    iVar19 = local_a4;
    pBVar10 = (BitmapArray<long> *)iVar20.pos_;
    pBVar18 = iVar20.array_;
    lVar13 = local_e8.pos_ - pVar16;
    lVar17 = last.pos_ - local_c8.pos_;
    uVar9 = local_c8.pos_ - (long)pBVar10;
    local_118.m_a = iVar20;
    if (lVar17 < lVar13) {
      if ((long)uVar9 < lVar13) {
        if ((long)uVar9 < lVar17) {
          local_118.m_a.array_ = local_120;
          local_118.m_b.array_ = local_e8.array_;
          local_118.m_b.pos_ = local_e8.pos_;
          local_118.m_c = (long)local_128;
          local_118.m_d = local_a4;
          piVar2 = *(iterator **)(local_a0 + 0x30);
          if (piVar2 == (iterator *)(*(long *)(local_a0 + 0x40) + -0x30)) {
            local_b0 = pBVar10;
            local_118.m_a.pos_ = pVar16;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      (local_a0,&local_118);
            pBVar10 = local_b0;
          }
          else {
            piVar2[2].array_ = local_128;
            piVar2[2].pos_ = CONCAT44(local_118._44_4_,local_a4);
            piVar2[1].array_ = local_e8.array_;
            piVar2[1].pos_ = local_e8.pos_;
            *piVar2 = first;
            *(long *)(local_a0 + 0x30) = *(long *)(local_a0 + 0x30) + 0x30;
          }
          local_118.m_a.pos_ = local_c8.pos_;
          local_118.m_a.array_ = local_c8.array_;
          local_118.m_b.array_ = last.array_;
          local_118.m_b.pos_ = last.pos_;
          local_118.m_c = (long)local_128;
          local_118.m_d = iVar19;
          puVar3 = *(undefined8 **)((long)stack + 0x30);
          if (puVar3 == (undefined8 *)(*(long *)((long)stack + 0x40) + -0x30)) {
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                        *)stack,&local_118);
          }
          else {
            puVar3[4] = local_128;
            puVar3[5] = CONCAT44(local_118._44_4_,iVar19);
            puVar3[2] = last.array_;
            puVar3[3] = last.pos_;
            *puVar3 = local_c8.array_;
            puVar3[1] = local_c8.pos_;
            *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x30;
          }
          uVar9 = local_c8.pos_ - (long)pBVar10;
          if ((long)uVar9 < 0x100) {
LAB_00107625:
            iVar19 = 0;
          }
          else {
            iVar19 = 0;
            uVar11 = uVar9;
            do {
              iVar19 = iVar19 + 8;
              uVar9 = uVar11 >> 8;
              bVar6 = 0xffff < uVar11;
              uVar11 = uVar9;
            } while (bVar6);
          }
          goto LAB_00107628;
        }
        local_118.m_b.array_ = local_e8.array_;
        local_118.m_b.pos_ = local_e8.pos_;
        local_118.m_c = (long)local_128;
        local_118.m_d = local_a4;
        piVar2 = *(iterator **)(local_a0 + 0x30);
        if (piVar2 == (iterator *)(*(long *)(local_a0 + 0x40) + -0x30)) {
          local_118.m_a = first;
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    (local_a0,&local_118);
        }
        else {
          piVar2[2].array_ = local_128;
          piVar2[2].pos_ = CONCAT44(local_118._44_4_,local_a4);
          piVar2[1].array_ = local_e8.array_;
          piVar2[1].pos_ = local_e8.pos_;
          *piVar2 = first;
          *(long *)(local_a0 + 0x30) = *(long *)(local_a0 + 0x30) + 0x30;
        }
        uVar9 = local_c8.pos_ - (long)pBVar10;
        local_118.m_d = 0;
        if (0xff < (long)uVar9) {
          local_118.m_d = 0;
          uVar11 = uVar9;
          do {
            local_118.m_d = local_118.m_d + 8;
            uVar9 = uVar11 >> 8;
            bVar6 = 0xffff < uVar11;
            uVar11 = uVar9;
          } while (bVar6);
        }
        local_118.m_c = (long)&(local_128->super_Bitmap)._vptr_Bitmap + 1;
        local_118.m_d = local_118.m_d + (&helper::log2table)[uVar9];
        local_118.m_b.array_ = local_c8.array_;
        local_118.m_b.pos_ = local_c8.pos_;
        local_118.m_a = iVar20;
      }
      else {
        local_118.m_d = 0;
        if (0xff < (long)uVar9) {
          local_118.m_d = 0;
          uVar11 = uVar9;
          do {
            local_118.m_d = local_118.m_d + 8;
            uVar9 = uVar11 >> 8;
            bVar6 = 0xffff < uVar11;
            uVar11 = uVar9;
          } while (bVar6);
        }
        local_118.m_c = (long)&(local_128->super_Bitmap)._vptr_Bitmap + 1;
        local_118.m_d = local_118.m_d + (&helper::log2table)[uVar9];
        local_118.m_b.array_ = local_c8.array_;
        local_118.m_b.pos_ = local_c8.pos_;
        piVar2 = *(iterator **)(local_a0 + 0x30);
        if (piVar2 == (iterator *)(*(long *)(local_a0 + 0x40) + -0x30)) {
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    (local_a0,&local_118);
        }
        else {
          piVar2[2].array_ = (BitmapArray<long> *)local_118.m_c;
          piVar2[2].pos_ = CONCAT44(local_118._44_4_,local_118.m_d);
          piVar2[1].array_ = local_c8.array_;
          piVar2[1].pos_ = local_c8.pos_;
          *piVar2 = iVar20;
          *(long *)(local_a0 + 0x30) = *(long *)(local_a0 + 0x30) + 0x30;
        }
        local_118.m_b.array_ = local_e8.array_;
        local_118.m_b.pos_ = local_e8.pos_;
        local_118.m_c = (long)local_128;
        local_118.m_d = iVar19;
        local_118.m_a = first;
      }
      puVar3 = *(undefined8 **)((long)stack + 0x30);
      if (puVar3 == (undefined8 *)(*(long *)((long)stack + 0x40) + -0x30)) {
        std::
        deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
        ::
        _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                  ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                    *)stack,&local_118);
      }
      else {
        puVar3[4] = local_118.m_c;
        puVar3[5] = CONCAT44(local_118._44_4_,local_118.m_d);
        puVar3[2] = local_118.m_b.array_;
        puVar3[3] = local_118.m_b.pos_;
        *puVar3 = local_118.m_a.array_;
        puVar3[1] = local_118.m_a.pos_;
        *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x30;
      }
      first.pos_ = local_c8.pos_;
      first.array_ = local_c8.array_;
    }
    else if ((long)uVar9 < lVar17) {
      if ((long)uVar9 < lVar13) {
        local_118.m_a.array_ = local_c8.array_;
        local_118.m_a.pos_ = local_c8.pos_;
        local_118.m_b.array_ = last.array_;
        local_118.m_b.pos_ = last.pos_;
        local_118.m_c = (long)local_128;
        local_118.m_d = local_a4;
        puVar3 = *(undefined8 **)(local_a0 + 0x30);
        if (puVar3 == (undefined8 *)(*(long *)(local_a0 + 0x40) + -0x30)) {
          local_b0 = pBVar18;
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    (local_a0,&local_118);
          pBVar18 = local_b0;
        }
        else {
          puVar3[4] = local_128;
          puVar3[5] = CONCAT44(local_118._44_4_,local_a4);
          puVar3[2] = last.array_;
          puVar3[3] = last.pos_;
          *puVar3 = local_c8.array_;
          puVar3[1] = local_c8.pos_;
          *(long *)(local_a0 + 0x30) = *(long *)(local_a0 + 0x30) + 0x30;
        }
        local_118.m_b.array_ = local_e8.array_;
        local_118.m_b.pos_ = local_e8.pos_;
        local_118.m_c = (long)local_128;
        local_118.m_d = iVar19;
        piVar2 = *(iterator **)((long)stack + 0x30);
        if (piVar2 == (iterator *)(*(long *)((long)stack + 0x40) + -0x30)) {
          local_118.m_a = first;
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                      *)stack,&local_118);
        }
        else {
          piVar2[2].array_ = local_128;
          piVar2[2].pos_ = CONCAT44(local_118._44_4_,iVar19);
          piVar2[1].array_ = local_e8.array_;
          piVar2[1].pos_ = local_e8.pos_;
          *piVar2 = first;
          *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x30;
          local_118.m_a = first;
        }
        uVar9 = local_c8.pos_ - (long)pBVar10;
        if ((long)uVar9 < 0x100) goto LAB_00107625;
        iVar19 = 0;
        uVar11 = uVar9;
        do {
          iVar19 = iVar19 + 8;
          uVar9 = uVar11 >> 8;
          bVar6 = 0xffff < uVar11;
          uVar11 = uVar9;
        } while (bVar6);
LAB_00107628:
        local_128 = (BitmapArray<long> *)((long)&(local_128->super_Bitmap)._vptr_Bitmap + 1);
        iVar19 = iVar19 + (&helper::log2table)[uVar9];
        first.pos_ = (pos_type)pBVar10;
        first.array_ = pBVar18;
        last.array_ = local_c8.array_;
        last.pos_ = local_c8.pos_;
      }
      else {
        local_118.m_a.array_ = local_c8.array_;
        local_118.m_a.pos_ = local_c8.pos_;
        local_118.m_b.array_ = last.array_;
        local_118.m_b.pos_ = last.pos_;
        local_118.m_c = (long)local_128;
        local_118.m_d = local_a4;
        puVar3 = *(undefined8 **)(local_a0 + 0x30);
        if (puVar3 == (undefined8 *)(*(long *)(local_a0 + 0x40) + -0x30)) {
          local_b0 = pBVar10;
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    (local_a0,&local_118);
          pBVar10 = local_b0;
        }
        else {
          puVar3[4] = local_128;
          puVar3[5] = CONCAT44(local_118._44_4_,local_a4);
          puVar3[2] = last.array_;
          puVar3[3] = last.pos_;
          *puVar3 = local_c8.array_;
          puVar3[1] = local_c8.pos_;
          *(long *)(local_a0 + 0x30) = *(long *)(local_a0 + 0x30) + 0x30;
        }
        uVar9 = local_c8.pos_ - (long)pBVar10;
        local_118.m_d = 0;
        if (0xff < (long)uVar9) {
          local_118.m_d = 0;
          uVar11 = uVar9;
          do {
            local_118.m_d = local_118.m_d + 8;
            uVar9 = uVar11 >> 8;
            bVar6 = 0xffff < uVar11;
            uVar11 = uVar9;
          } while (bVar6);
        }
        local_118.m_c = (long)&(local_128->super_Bitmap)._vptr_Bitmap + 1;
        local_118.m_d = local_118.m_d + (&helper::log2table)[uVar9];
        local_118.m_a.pos_ = (pos_type)pBVar10;
        local_118.m_a.array_ = pBVar18;
        local_118.m_b.array_ = local_c8.array_;
        local_118.m_b.pos_ = local_c8.pos_;
        ppVar4 = *(pos_type **)((long)stack + 0x30);
        if (ppVar4 == (pos_type *)(*(long *)((long)stack + 0x40) + -0x30)) {
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                      *)stack,&local_118);
        }
        else {
          ppVar4[4] = local_118.m_c;
          ppVar4[5] = CONCAT44(local_118._44_4_,local_118.m_d);
          ppVar4[2] = (pos_type)local_c8.array_;
          ppVar4[3] = local_c8.pos_;
          *ppVar4 = (pos_type)pBVar18;
          ppVar4[1] = (pos_type)pBVar10;
          *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x30;
        }
        last.array_ = local_e8.array_;
        last.pos_ = local_e8.pos_;
      }
    }
    else {
      local_118.m_d = 0;
      if (0xff < (long)uVar9) {
        local_118.m_d = 0;
        uVar11 = uVar9;
        do {
          local_118.m_d = local_118.m_d + 8;
          uVar9 = uVar11 >> 8;
          bVar6 = 0xffff < uVar11;
          uVar11 = uVar9;
        } while (bVar6);
      }
      local_118.m_c = (long)&(local_128->super_Bitmap)._vptr_Bitmap + 1;
      local_118.m_d = local_118.m_d + (&helper::log2table)[uVar9];
      local_118.m_b.array_ = local_c8.array_;
      local_118.m_b.pos_ = local_c8.pos_;
      piVar2 = *(iterator **)(local_a0 + 0x30);
      if (piVar2 == (iterator *)(*(long *)(local_a0 + 0x40) + -0x30)) {
        std::
        deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
        ::
        _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                  (local_a0,&local_118);
      }
      else {
        piVar2[2].array_ = (BitmapArray<long> *)local_118.m_c;
        piVar2[2].pos_ = CONCAT44(local_118._44_4_,local_118.m_d);
        piVar2[1].array_ = local_c8.array_;
        piVar2[1].pos_ = local_c8.pos_;
        *piVar2 = iVar20;
        *(long *)(local_a0 + 0x30) = *(long *)(local_a0 + 0x30) + 0x30;
      }
      local_118.m_a.pos_ = local_c8.pos_;
      local_118.m_a.array_ = local_c8.array_;
      local_118.m_b.array_ = last.array_;
      local_118.m_b.pos_ = last.pos_;
      local_118.m_c = (long)local_128;
      local_118.m_d = iVar19;
      puVar3 = *(undefined8 **)((long)stack + 0x30);
      if (puVar3 == (undefined8 *)(*(long *)((long)stack + 0x40) + -0x30)) {
        std::
        deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
        ::
        _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                  ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                    *)stack,&local_118);
      }
      else {
        puVar3[4] = local_128;
        puVar3[5] = CONCAT44(local_118._44_4_,iVar19);
        puVar3[2] = last.array_;
        puVar3[3] = last.pos_;
        *puVar3 = local_c8.array_;
        puVar3[1] = local_c8.pos_;
        *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x30;
      }
      last.array_ = local_e8.array_;
      last.pos_ = local_e8.pos_;
    }
  } while( true );
}

Assistant:

void mintrosort(
    stack_type &stack, const StringIterator_type T, const SAIterator_type PA,
    SAIterator_type first, SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  typedef typename std::iterator_traits<StringIterator_type>::value_type value_type;
  typedef substring_wrapper<StringIterator_type, SAIterator_type> wrapper_type;
  typedef typename stack_type::value_type stackinfo_type;

  SAIterator_type a, b, c;
  value_type v, x;
  int limit;

  for (limit = helper::lg(last - first);;) {

    if ((last - first) <= 8) {
      if (1 < (last - first)) {
        insertionsort(T, PA, first, last, depth);
      }
      STACK_POP4(first, last, depth, limit);
      continue;
    }

    const StringIterator_type Td = T + depth;
    if (limit-- == 0) {
      helper::heapsort(wrapper_type(Td, PA), first, last - first);
    }
    if (limit < 0) {
      for (a = first + 1, v = Td[PA[*first]]; a < last; ++a) {
        if ((x = Td[PA[*a]]) != v) {
          if (1 < (a - first)) {
            break;
          }
          v = x;
          first = a;
        }
      }
      if (Td[PA[*first] - 1] < v) {
        first = partition(PA, first, a, depth);
      }
      if ((a - first) <= (last - a)) {
        if (1 < (a - first)) {
          STACK_PUSH4(a, last, depth, -1);
          last = a, depth += 1, limit = helper::lg(a - first);
        } else {
          first = a, limit = -1;
        }
      } else {
        if (1 < (last - a)) {
          STACK_PUSH4(first, a, depth + 1, helper::lg(a - first));
          first = a, limit = -1;
        } else {
          last = a, depth += 1, limit = helper::lg(a - first);
        }
      }
      continue;
    }

    /* partition */
    a = helper::pivot(wrapper_type(Td, PA), first, last);
    std::iter_swap(first, a);
    if (helper::partition(wrapper_type(Td, PA), first, first + 1, last, a, c,
                          Td[PA[*first]]) != false) {
      b = (Td[PA[*a]] <= Td[PA[*a] - 1]) ? a : partition(PA, a, c, depth);

      if ((a - first) <= (last - c)) {
        if ((last - c) <= (c - b)) {
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          STACK_PUSH4(c, last, depth, limit);
          last = a;
        } else if ((a - first) <= (c - b)) {
          STACK_PUSH4(c, last, depth, limit);
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          last = a;
        } else {
          STACK_PUSH4(c, last, depth, limit);
          STACK_PUSH4(first, a, depth, limit);
          first = b, last = c, depth += 1, limit = helper::lg(c - b);
        }
      } else {
        if ((a - first) <= (c - b)) {
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          STACK_PUSH4(first, a, depth, limit);
          first = c;
        } else if ((last - c) <= (c - b)) {
          STACK_PUSH4(first, a, depth, limit);
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          first = c;
        } else {
          STACK_PUSH4(first, a, depth, limit);
          STACK_PUSH4(c, last, depth, limit);
          first = b, last = c, depth += 1, limit = helper::lg(c - b);
        }
      }
    } else {
      limit += 1;
      if (Td[PA[*first] - 1] < Td[PA[*first]]) {
        first = partition(PA, first, last, depth);
        limit = helper::lg(last - first);
      }
      depth += 1;
    }
  }
}